

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O2

string * __thiscall
NDevice::getPrintStr_abi_cxx11_(string *__return_storage_ptr__,NDevice *this,int indent)

{
  string *psVar1;
  ostream *poVar2;
  reference this_00;
  int iVar3;
  int iVar4;
  size_type __n;
  bool bVar5;
  string indentStr;
  ostringstream oss;
  string local_1f8 [32];
  string *local_1d8;
  vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> *local_1d0;
  string local_1c8;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__cxx11::string::string(local_1f8,"    ",(allocator *)&local_1c8);
  iVar3 = 0;
  if (0 < indent) {
    iVar3 = indent;
  }
  iVar4 = iVar3;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    std::operator<<((ostream *)local_1a8,local_1f8);
  }
  std::operator<<((ostream *)local_1a8,"Printing \'NDevice\'\n");
  iVar4 = iVar3;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    std::operator<<((ostream *)local_1a8,local_1f8);
  }
  poVar2 = std::operator<<((ostream *)local_1a8,"    -name       : ");
  poVar2 = std::operator<<(poVar2,(string *)&this->name);
  std::operator<<(poVar2,"\n");
  iVar4 = iVar3;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    std::operator<<((ostream *)local_1a8,local_1f8);
  }
  poVar2 = std::operator<<((ostream *)local_1a8,"    -numBytes   : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->numBytes);
  std::operator<<(poVar2,"\n");
  iVar4 = iVar3;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    std::operator<<((ostream *)local_1a8,local_1f8);
  }
  poVar2 = std::operator<<((ostream *)local_1a8,"    -byteOffset : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->byteOffset);
  std::operator<<(poVar2,"\n");
  iVar4 = iVar3;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    std::operator<<((ostream *)local_1a8,local_1f8);
  }
  poVar2 = std::operator<<((ostream *)local_1a8,"    -Channels vector size[");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"]:\n");
  local_1d0 = &this->channels;
  local_1d8 = __return_storage_ptr__;
  for (__n = 0; psVar1 = local_1d8, iVar4 = iVar3,
      (long)__n <
      (long)(int)((ulong)((long)(this->channels).
                                super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->channels).
                               super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 6); __n = __n + 1) {
    while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
      std::operator<<((ostream *)local_1a8,local_1f8);
    }
    poVar2 = std::operator<<((ostream *)local_1a8,"        - i[");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)__n);
    poVar2 = std::operator<<(poVar2,"] : \n");
    this_00 = std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>::at(local_1d0,__n);
    NDeviceChannel::getPrintStr_abi_cxx11_(&local_1c8,this_00,indent + 2);
    poVar2 = std::operator<<(poVar2,(string *)&local_1c8);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string(local_1f8);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return psVar1;
}

Assistant:

std::string NDevice::getPrintStr(int indent) {
    std::ostringstream oss;
    std::string indentStr = "    ";
    for (int k = 0; k < indent; k++) { oss << indentStr; }
    oss << "Printing 'NDevice'\n";
    for (int k = 0; k < indent; k++) { oss << indentStr; }
    oss << "    -name       : " << name << "\n";
    for (int k = 0; k < indent; k++) { oss << indentStr; }
    oss << "    -numBytes   : " << numBytes << "\n";
    for (int k = 0; k < indent; k++) { oss << indentStr; }
    oss << "    -byteOffset : " << byteOffset << "\n";
    for (int k = 0; k < indent; k++) { oss << indentStr; }
    oss << "    -Channels vector size[" << channels.size() << "]:\n";
    for (int i = 0; i < (int)channels.size(); i++) {
        for (int k = 0; k < indent; k++) { oss << indentStr; }
        oss << "        - i[" << i << "] : \n" << channels.at(i).getPrintStr(indent+2) << "\n";
    }
    return(oss.str());
}